

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O0

void __thiscall
charls::
jls_codec<charls::lossless_traits<charls::triplet<unsigned_char>,_8>,_charls::decoder_strategy>::
do_line(jls_codec<charls::lossless_traits<charls::triplet<unsigned_char>,_8>,_charls::decoder_strategy>
        *this,triplet<unsigned_char> *param_1)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  anon_union_1_2_7f9ecd68_for_triplet<unsigned_char>_1 aVar13;
  anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3 aVar14;
  int32_t iVar15;
  int32_t iVar16;
  int32_t iVar17;
  int32_t iVar18;
  pixel_type *ppVar19;
  undefined2 local_37;
  sample_type local_35;
  int32_t local_34;
  int32_t iStack_30;
  triplet<unsigned_char> rx;
  int32_t qs3;
  int32_t qs2;
  int32_t qs1;
  triplet<unsigned_char> rd;
  triplet<unsigned_char> rb;
  triplet<unsigned_char> rc;
  triplet<unsigned_char> ra;
  int32_t index;
  triplet<unsigned_char> *param_1_local;
  jls_codec<charls::lossless_traits<charls::triplet<unsigned_char>,_8>,_charls::decoder_strategy>
  *this_local;
  
  stack0xffffffffffffffe4 = 0;
  while (stack0xffffffffffffffe4 < this->width_) {
    ppVar19 = this->current_line_ + (int)(stack0xffffffffffffffe4 - 1);
    uVar5 = ppVar19->field_0;
    uVar9 = ppVar19->field_1;
    bVar1 = (ppVar19->field_2).v3;
    ppVar19 = this->previous_line_ + (int)(stack0xffffffffffffffe4 - 1);
    uVar6 = ppVar19->field_0;
    uVar10 = ppVar19->field_1;
    bVar2 = (ppVar19->field_2).v3;
    ppVar19 = this->previous_line_ + (int)stack0xffffffffffffffe4;
    uVar7 = ppVar19->field_0;
    uVar11 = ppVar19->field_1;
    bVar3 = (ppVar19->field_2).v3;
    ppVar19 = this->previous_line_ + (int)(stack0xffffffffffffffe4 + 1);
    uVar8 = ppVar19->field_0;
    uVar12 = ppVar19->field_1;
    bVar4 = (ppVar19->field_2).v3;
    iVar15 = quantize_gradient(this,(uint)(byte)uVar8 - (uint)(byte)uVar7);
    iVar16 = quantize_gradient(this,(uint)(byte)uVar7 - (uint)(byte)uVar6);
    iVar17 = quantize_gradient(this,(uint)(byte)uVar6 - (uint)(byte)uVar5);
    iVar15 = compute_context_id(iVar15,iVar16,iVar17);
    iVar16 = quantize_gradient(this,(uint)(byte)uVar12 - (uint)(byte)uVar11);
    iVar17 = quantize_gradient(this,(uint)(byte)uVar11 - (uint)(byte)uVar10);
    iVar18 = quantize_gradient(this,(uint)(byte)uVar10 - (uint)(byte)uVar9);
    iStack_30 = compute_context_id(iVar16,iVar17,iVar18);
    iVar16 = quantize_gradient(this,(uint)bVar4 - (uint)bVar3);
    iVar17 = quantize_gradient(this,(uint)bVar3 - (uint)bVar2);
    iVar18 = quantize_gradient(this,(uint)bVar2 - (uint)bVar1);
    local_34 = compute_context_id(iVar16,iVar17,iVar18);
    if (((iVar15 == 0) && (iStack_30 == 0)) && (local_34 == 0)) {
      iVar15 = do_run_mode(this,stack0xffffffffffffffe4,(decoder_strategy *)0x0);
      register0x00000000 = iVar15 + stack0xffffffffffffffe4;
    }
    else {
      triplet<unsigned_char>::triplet((triplet<unsigned_char> *)&local_37);
      bVar4 = this->current_line_[(int)stack0xffffffffffffffe4].field_0.v1;
      iVar16 = get_predicted_value((uint)(byte)uVar5,(uint)(byte)uVar7,(uint)(byte)uVar6);
      aVar13.v1 = do_regular(this,iVar15,(uint)bVar4,iVar16,(decoder_strategy *)0x0);
      iVar15 = iStack_30;
      local_37._0_1_ = aVar13.v1;
      bVar4 = this->current_line_[(int)stack0xffffffffffffffe4].field_1.v2;
      iVar16 = get_predicted_value((uint)(byte)uVar9,(uint)(byte)uVar11,(uint)(byte)uVar10);
      aVar14.v2 = do_regular(this,iVar15,(uint)bVar4,iVar16,(decoder_strategy *)0x0);
      iVar15 = local_34;
      local_37._1_1_ = aVar14.v2;
      bVar4 = this->current_line_[(int)stack0xffffffffffffffe4].field_2.v3;
      iVar16 = get_predicted_value((uint)bVar1,(uint)bVar3,(uint)bVar2);
      local_35 = do_regular(this,iVar15,(uint)bVar4,iVar16,(decoder_strategy *)0x0);
      ppVar19 = this->current_line_ + (int)stack0xffffffffffffffe4;
      ppVar19->field_0 = local_37._0_1_;
      ppVar19->field_1 = local_37._1_1_;
      (ppVar19->field_2).v3 = local_35;
      register0x00000000 = stack0xffffffffffffffe4 + 1;
    }
  }
  return;
}

Assistant:

void do_line(triplet<sample_type>* /*template_selector*/)
    {
        int32_t index{};
        while (static_cast<uint32_t>(index) < width_)
        {
            const triplet<sample_type> ra{current_line_[index - 1]};
            const triplet<sample_type> rc{previous_line_[index - 1]};
            const triplet<sample_type> rb{previous_line_[index]};
            const triplet<sample_type> rd{previous_line_[index + 1]};

            const int32_t qs1{compute_context_id(quantize_gradient(rd.v1 - rb.v1), quantize_gradient(rb.v1 - rc.v1),
                                                 quantize_gradient(rc.v1 - ra.v1))};
            const int32_t qs2{compute_context_id(quantize_gradient(rd.v2 - rb.v2), quantize_gradient(rb.v2 - rc.v2),
                                                 quantize_gradient(rc.v2 - ra.v2))};
            const int32_t qs3{compute_context_id(quantize_gradient(rd.v3 - rb.v3), quantize_gradient(rb.v3 - rc.v3),
                                                 quantize_gradient(rc.v3 - ra.v3))};

            if (qs1 == 0 && qs2 == 0 && qs3 == 0)
            {
                index += do_run_mode(index, static_cast<Strategy*>(nullptr));
            }
            else
            {
                triplet<sample_type> rx;
                rx.v1 = do_regular(qs1, current_line_[index].v1, get_predicted_value(ra.v1, rb.v1, rc.v1),
                                   static_cast<Strategy*>(nullptr));
                rx.v2 = do_regular(qs2, current_line_[index].v2, get_predicted_value(ra.v2, rb.v2, rc.v2),
                                   static_cast<Strategy*>(nullptr));
                rx.v3 = do_regular(qs3, current_line_[index].v3, get_predicted_value(ra.v3, rb.v3, rc.v3),
                                   static_cast<Strategy*>(nullptr));
                current_line_[index] = rx;
                ++index;
            }
        }
    }